

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetaction.cpp
# Opt level: O0

void __thiscall QWidgetAction::setDefaultWidget(QWidgetAction *this,QWidget *widget)

{
  long lVar1;
  bool bVar2;
  QWidgetActionPrivate *this_00;
  QWidgetPrivate *this_01;
  ulong uVar3;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  QWidgetActionPrivate *d;
  QWidget *in_stack_ffffffffffffffc8;
  QWidget **in_stack_ffffffffffffffd0;
  undefined1 enable;
  QWidget *parent;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  parent = in_RDI;
  this_00 = d_func((QWidgetAction *)0x4b0baf);
  bVar2 = ::operator==(in_stack_ffffffffffffffd0,(QPointer<QWidget> *)in_stack_ffffffffffffffc8);
  if ((!bVar2) && ((this_00->field_0x1d0 & 1) == 0)) {
    this_01 = (QWidgetPrivate *)::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x4b0bf9)
    ;
    if (this_01 != (QWidgetPrivate *)0x0) {
      (**(code **)(*(long *)this_01 + 0x20))();
    }
    QPointer<QWidget>::operator=((QPointer<QWidget> *)this_01,in_stack_ffffffffffffffc8);
    if (in_RSI != (QWidget *)0x0) {
      QWidgetPrivate::get((QWidget *)0x4b0c3c);
      QWidgetPrivate::isExplicitlyHidden(this_01);
      QAction::setVisible(SUB81(in_RDI,0));
      enable = (undefined1)((ulong)in_RDI >> 0x38);
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x4b0c67);
      QWidget::hide((QWidget *)0x4b0c6f);
      QPointer<QWidget>::operator->((QPointer<QWidget> *)0x4b0c80);
      QWidget::setParent(in_RSI,parent);
      this_00->field_0x1d0 = this_00->field_0x1d0 & 0xfe;
      uVar3 = QAction::isEnabled();
      if ((uVar3 & 1) == 0) {
        QPointer<QWidget>::operator->((QPointer<QWidget> *)0x4b0cc2);
        QWidget::setEnabled((QWidget *)this_00,(bool)enable);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetAction::setDefaultWidget(QWidget *widget)
{
    Q_D(QWidgetAction);
    if (widget == d->defaultWidget || d->defaultWidgetInUse)
        return;
    delete d->defaultWidget;
    d->defaultWidget = widget;
    if (!widget)
        return;

    setVisible(!QWidgetPrivate::get(widget)->isExplicitlyHidden());
    d->defaultWidget->hide();
    d->defaultWidget->setParent(nullptr);
    d->defaultWidgetInUse = false;
    if (!isEnabled())
        d->defaultWidget->setEnabled(false);
}